

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

void sysbvm_function_addFlags
               (sysbvm_context_t *context,sysbvm_tuple_t function,sysbvm_bitflags_t flags)

{
  _Bool _Var1;
  sysbvm_bitflags_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_function_t *functionObject;
  sysbvm_bitflags_t flags_local;
  sysbvm_tuple_t function_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isFunction(context,function);
  if (!_Var1) {
    sysbvm_error("Expected a function.");
  }
  sVar2 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(function + 0x28));
  sVar3 = sysbvm_tuple_bitflags_encode(sVar2 | flags);
  *(sysbvm_tuple_t *)(function + 0x28) = sVar3;
  return;
}

Assistant:

SYSBVM_API void sysbvm_function_addFlags(sysbvm_context_t *context, sysbvm_tuple_t function, sysbvm_bitflags_t flags)
{
    if(!sysbvm_tuple_isFunction(context, function))
        sysbvm_error("Expected a function.");

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    functionObject->flags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode(functionObject->flags) | flags);
}